

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

string * __thiscall
cmFileAPI::ObjectName_abi_cxx11_(string *__return_storage_ptr__,cmFileAPI *this,Object *o)

{
  pointer __val;
  bool bVar1;
  char cVar2;
  pointer pcVar3;
  char cVar4;
  string __str;
  long *local_38;
  uint local_30;
  long local_28 [2];
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,
             ObjectKindName::objectKindNames[*(int *)&this->CMakeInstance],
             (allocator<char> *)&local_38);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  __val = (this->APIv1)._M_dataplus._M_p;
  cVar4 = '\x01';
  if ((pointer)0x9 < __val) {
    pcVar3 = __val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (pcVar3 < (pointer)0x64) {
        cVar4 = cVar4 + -2;
        goto LAB_0037dcd8;
      }
      if (pcVar3 < (pointer)0x3e8) {
        cVar4 = cVar4 + -1;
        goto LAB_0037dcd8;
      }
      if (pcVar3 < (pointer)0x2710) goto LAB_0037dcd8;
      bVar1 = (pointer)0x1869f < pcVar3;
      pcVar3 = (pointer)((ulong)pcVar3 / 10000);
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0037dcd8:
  local_38 = local_28;
  std::__cxx11::string::_M_construct((ulong)&local_38,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_38,local_30,(unsigned_long)__val);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_38);
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmFileAPI::ObjectName(Object const& o)
{
  std::string name = ObjectKindName(o.Kind);
  name += "-v";
  name += std::to_string(o.Version);
  return name;
}